

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O0

int dwarfstring_append_length(dwarfstring_s *g,char *str,size_t slen)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t newlen;
  int r;
  size_t lastpos;
  size_t slen_local;
  char *str_local;
  dwarfstring_s *g_local;
  
  sVar1 = g->s_size;
  sVar2 = g->s_avail;
  if ((str == (char *)0x0) || (slen == 0)) {
    g_local._4_4_ = 1;
  }
  else if ((slen < g->s_avail) || (iVar3 = dwarfstring_add_to(g,g->s_size + slen + 2), iVar3 != 0))
  {
    memcpy(g->s_data + (sVar1 - sVar2),str,slen);
    g->s_avail = g->s_avail - slen;
    g->s_data[g->s_size - g->s_avail] = '\0';
    g_local._4_4_ = 1;
  }
  else {
    g_local._4_4_ = 0;
  }
  return g_local._4_4_;
}

Assistant:

int
dwarfstring_append_length(struct dwarfstring_s *g,char *str,
    size_t slen)
{
    /*  lastpos is the length of characters
        without the null-terminator  we call it strlen */
    size_t lastpos = g->s_size - g->s_avail;
    int r          = 0;

    if (!str  || slen ==0) {
        return TRUE;
    }
    if (slen >= g->s_avail) {
        size_t newlen = 0;

        newlen = g->s_size + slen+2;
        r = dwarfstring_add_to(g,newlen);
        if (!r) {
            /* Unable to resize, dare not do anything. */
            return FALSE;
        }
    }
    memcpy(g->s_data + lastpos,str,slen);
    g->s_avail -= slen;
    /*  Adding string terminating null byte.
        Space is guaranteed available to do this.*/
    g->s_data[g->s_size - g->s_avail] = 0;
    return TRUE;
}